

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemListView.cpp
# Opt level: O0

QStringList * __thiscall QFileSystemListView::selection(QFileSystemListView *this)

{
  undefined1 uVar1;
  QModelIndex *t;
  QList<QModelIndex> *in_RDI;
  QModelIndex *index;
  QForeachContainer<QList<QModelIndex>_> _container_232;
  QModelIndexList indexes;
  QStringList *selection;
  undefined7 in_stack_ffffffffffffff30;
  QFileInfo local_a0 [32];
  QModelIndex *local_80;
  QModelIndex *local_78;
  const_iterator local_48;
  const_iterator local_40;
  undefined1 local_29;
  undefined1 local_28 [40];
  
  QAbstractItemView::selectionModel();
  QListView::modelColumn();
  QItemSelectionModel::selectedRows((int)local_28);
  local_29 = 0;
  QList<QString>::QList((QList<QString> *)0x234060);
  QtPrivate::qMakeForeachContainer<QList<QModelIndex>const&>(in_RDI);
  while( true ) {
    local_78 = local_40.i;
    uVar1 = QList<QModelIndex>::const_iterator::operator!=(&local_48,local_40);
    if (!(bool)uVar1) break;
    t = QList<QModelIndex>::const_iterator::operator*(&local_48);
    local_80 = t;
    QFileSystemModel::fileInfo((QModelIndex *)local_a0);
    QFileInfo::absoluteFilePath();
    QList<QString>::operator<<
              ((QList<QString> *)CONCAT17(uVar1,in_stack_ffffffffffffff30),(rvalue_ref)t);
    QString::~QString((QString *)0x23413d);
    QFileInfo::~QFileInfo(local_a0);
    QList<QModelIndex>::const_iterator::operator++(&local_48);
  }
  QtPrivate::QForeachContainer<QList<QModelIndex>_>::~QForeachContainer
            ((QForeachContainer<QList<QModelIndex>_> *)0x2340ac);
  local_29 = 1;
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x2341c2);
  return (QStringList *)in_RDI;
}

Assistant:

QStringList QFileSystemListView::selection() const {
    const QModelIndexList indexes = selectionModel()->selectedRows(modelColumn());
    QStringList selection;

    foreach (const QModelIndex &index, indexes) {
        selection << d->model->fileInfo(index).absoluteFilePath();
    }

    return selection;
}